

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall cmFindPackageCommand::StoreVersionFound(cmFindPackageCommand *this)

{
  cmMakefile *pcVar1;
  string ver;
  char buf [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  string local_78;
  char local_58 [72];
  
  std::__cxx11::string::string((string *)&local_78,(string *)&this->Name);
  std::__cxx11::string::append((char *)&local_78);
  if ((this->VersionFound)._M_string_length == 0) {
    cmMakefile::RemoveDefinition((this->super_cmFindCommon).super_cmCommand.Makefile,&local_78);
  }
  else {
    cmMakefile::AddDefinition
              ((this->super_cmFindCommon).super_cmCommand.Makefile,&local_78,
               (this->VersionFound)._M_dataplus._M_p);
  }
  sprintf(local_58,"%u",(ulong)this->VersionFoundMajor);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::operator+(&bStack_98,&local_78,"_MAJOR");
  cmMakefile::AddDefinition(pcVar1,&bStack_98,local_58);
  std::__cxx11::string::~string((string *)&bStack_98);
  sprintf(local_58,"%u",(ulong)this->VersionFoundMinor);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::operator+(&bStack_98,&local_78,"_MINOR");
  cmMakefile::AddDefinition(pcVar1,&bStack_98,local_58);
  std::__cxx11::string::~string((string *)&bStack_98);
  sprintf(local_58,"%u",(ulong)this->VersionFoundPatch);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::operator+(&bStack_98,&local_78,"_PATCH");
  cmMakefile::AddDefinition(pcVar1,&bStack_98,local_58);
  std::__cxx11::string::~string((string *)&bStack_98);
  sprintf(local_58,"%u",(ulong)this->VersionFoundTweak);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::operator+(&bStack_98,&local_78,"_TWEAK");
  cmMakefile::AddDefinition(pcVar1,&bStack_98,local_58);
  std::__cxx11::string::~string((string *)&bStack_98);
  sprintf(local_58,"%u",(ulong)this->VersionFoundCount);
  pcVar1 = (this->super_cmFindCommon).super_cmCommand.Makefile;
  std::operator+(&bStack_98,&local_78,"_COUNT");
  cmMakefile::AddDefinition(pcVar1,&bStack_98,local_58);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

void cmFindPackageCommand::StoreVersionFound()
{
  // Store the whole version string.
  std::string ver = this->Name;
  ver += "_VERSION";
  if(this->VersionFound.empty())
    {
    this->Makefile->RemoveDefinition(ver);
    }
  else
    {
    this->Makefile->AddDefinition(ver, this->VersionFound.c_str());
    }

  // Store the version components.
  char buf[64];
  sprintf(buf, "%u", this->VersionFoundMajor);
  this->Makefile->AddDefinition(ver+"_MAJOR", buf);
  sprintf(buf, "%u", this->VersionFoundMinor);
  this->Makefile->AddDefinition(ver+"_MINOR", buf);
  sprintf(buf, "%u", this->VersionFoundPatch);
  this->Makefile->AddDefinition(ver+"_PATCH", buf);
  sprintf(buf, "%u", this->VersionFoundTweak);
  this->Makefile->AddDefinition(ver+"_TWEAK", buf);
  sprintf(buf, "%u", this->VersionFoundCount);
  this->Makefile->AddDefinition(ver+"_COUNT", buf);
}